

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O2

array<Centaurus::CharClass<wchar_t>,_3UL> * __thiscall
Centaurus::CharClass<wchar_t>::diff_and_int
          (array<Centaurus::CharClass<wchar_t>,_3UL> *__return_storage_ptr__,
          CharClass<wchar_t> *this,CharClass<wchar_t> *cc)

{
  pointer pRVar1;
  pointer pRVar2;
  pointer pRVar3;
  pointer pRVar4;
  pointer pRVar5;
  pointer pRVar6;
  Range<wchar_t> rj;
  Range<wchar_t> ri;
  Range<wchar_t> local_70;
  Range<wchar_t> local_60;
  Range<wchar_t> local_50;
  CharClass<wchar_t> *local_40;
  CharClass<wchar_t> *local_38;
  
  std::array<Centaurus::CharClass<wchar_t>,_3UL>::array(__return_storage_ptr__);
  pRVar2 = (this->m_ranges).
           super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pRVar5 = (cc->m_ranges).
           super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_50._vptr_Range = (_func_int **)&PTR__Range_0017df00;
  local_60._vptr_Range = (_func_int **)&PTR__Range_0017df00;
  local_50.m_start = L'\0';
  local_50.m_end = L'\0';
  local_60.m_start = L'\0';
  local_60.m_end = L'\0';
  pRVar1 = (this->m_ranges).
           super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pRVar2 != pRVar1) {
    local_50.m_start = pRVar2->m_start;
    local_50.m_end = pRVar2->m_end;
  }
  pRVar4 = (cc->m_ranges).
           super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pRVar5 != pRVar4) {
    local_60.m_start = pRVar5->m_start;
    local_60.m_end = pRVar5->m_end;
  }
  local_38 = __return_storage_ptr__->_M_elems + 1;
  local_40 = __return_storage_ptr__->_M_elems + 2;
  do {
    if ((pRVar2 == pRVar1) || (pRVar5 == pRVar4)) {
      while (pRVar4 = pRVar2, pRVar2 = pRVar4 + 1, pRVar4 != pRVar1) {
        append(__return_storage_ptr__->_M_elems,&local_50);
        pRVar1 = (this->m_ranges).
                 super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pRVar2 != pRVar1) {
          local_50.m_start = pRVar4[1].m_start;
          local_50.m_end = pRVar4[1].m_end;
        }
      }
      pRVar2 = (cc->m_ranges).
               super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      while (pRVar1 = pRVar5, pRVar5 = pRVar1 + 1, pRVar1 != pRVar2) {
        append(local_38,&local_60);
        pRVar2 = (cc->m_ranges).
                 super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pRVar5 != pRVar2) {
          local_60.m_start = pRVar1[1].m_start;
          local_60.m_end = pRVar1[1].m_end;
        }
      }
      return __return_storage_ptr__;
    }
    pRVar6 = pRVar5;
    if (local_60.m_start < local_50.m_end) {
      pRVar3 = pRVar2;
      if (local_50.m_start < local_60.m_end) {
        if (local_50.m_start < local_60.m_start) {
          local_70._vptr_Range = (_func_int **)&PTR__Range_0017df00;
          local_70.m_start = local_50.m_start;
          local_70.m_end = local_60.m_start;
          append(__return_storage_ptr__->_M_elems,&local_70);
          local_50.m_start = local_60.m_start;
        }
        else if (local_60.m_start < local_50.m_start) {
          local_70._vptr_Range = (_func_int **)&PTR__Range_0017df00;
          local_70.m_start = local_60.m_start;
          local_70.m_end = local_50.m_start;
          append(local_38,&local_70);
          local_60.m_start = local_50.m_start;
        }
        else {
          if (local_60.m_end < local_50.m_end) {
            local_70._vptr_Range = (_func_int **)&PTR__Range_0017df00;
            local_70.m_start = local_60.m_start;
            local_70.m_end = local_60.m_end;
            append(local_40,&local_70);
            local_50.m_start = local_60.m_end;
            goto LAB_0012c166;
          }
          if (local_50.m_end < local_60.m_end) {
            local_70._vptr_Range = (_func_int **)&PTR__Range_0017df00;
            local_70.m_start = local_50.m_start;
            local_70.m_end = local_50.m_end;
            append(local_40,&local_70);
            local_60.m_start = local_50.m_end;
            goto LAB_0012c141;
          }
          local_70._vptr_Range = (_func_int **)&PTR__Range_0017df00;
          local_70.m_start = local_50.m_start;
          local_70.m_end = local_60.m_end;
          append(local_40,&local_70);
          pRVar3 = pRVar2 + 1;
          if (pRVar3 != (this->m_ranges).
                        super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) {
            local_50.m_start = pRVar2[1].m_start;
            local_50.m_end = pRVar2[1].m_end;
          }
          pRVar6 = pRVar5 + 1;
          if (pRVar6 != (cc->m_ranges).
                        super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) {
            local_60.m_start = pRVar5[1].m_start;
            local_60.m_end = pRVar5[1].m_end;
          }
        }
      }
      else {
        append(local_38,&local_60);
LAB_0012c166:
        pRVar6 = pRVar5 + 1;
        if (pRVar6 != (cc->m_ranges).
                      super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
          local_60.m_start = pRVar5[1].m_start;
          local_60.m_end = pRVar5[1].m_end;
        }
      }
    }
    else {
      append(__return_storage_ptr__->_M_elems,&local_50);
LAB_0012c141:
      pRVar3 = pRVar2 + 1;
      if (pRVar3 != (this->m_ranges).
                    super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        local_50.m_start = pRVar2[1].m_start;
        local_50.m_end = pRVar2[1].m_end;
      }
    }
    pRVar1 = (this->m_ranges).
             super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pRVar4 = (cc->m_ranges).
             super__Vector_base<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pRVar5 = pRVar6;
    pRVar2 = pRVar3;
  } while( true );
}

Assistant:

std::array<CharClass<TCHAR>, 3> diff_and_int(const CharClass<TCHAR>& cc) const
    {
        //Returns 3 character classes
        //ret[0] => *this & ~cc
        //ret[1] => ~(*this) & cc
        //ret[2] => *this & cc
        std::array<CharClass<TCHAR>, 3> ret;

        auto i = m_ranges.cbegin();
        auto j = cc.m_ranges.cbegin();
        
        Range<TCHAR> ri, rj;

        if (i != m_ranges.cend())
            ri = *i;
        if (j != cc.m_ranges.cend())
            rj = *j;

        while (i != m_ranges.cend() && j != cc.m_ranges.cend())
        {
            if (ri < rj)
            {
                ret[0].append(ri);
                if (++i != m_ranges.cend())
                    ri = *i;
            }
            else if (ri > rj)
            {
                ret[1].append(rj);
                if (++j != cc.m_ranges.cend())
                    rj = *j;
            }
            else
            {
                if (ri.start() < rj.start())
                {
                    //When ri begins earlier than rj
                    ret[0].append(Range<TCHAR>(ri.start(), rj.start()));
                    ri.start(rj.start());
                }
                else if (rj.start() < ri.start())
                {
                    //When rj begins earlier than ri
                    ret[1].append(Range<TCHAR>(rj.start(), ri.start()));
                    rj.start(ri.start());
                }
                else
                {
                    //ri.start() == rj.start()
                    if (ri.end() > rj.end())
                    {
                        //When ri ends later than rj
                        ret[2].append(Range<TCHAR>(rj.start(), rj.end()));
                        ri.start(rj.end());
                        if (++j != cc.m_ranges.cend())
                            rj = *j;
                    }
                    else if (ri.end() < rj.end())
                    {
                        //When rj ends later than ri
                        ret[2].append(Range<TCHAR>(ri.start(), ri.end()));
                        rj.start(ri.end());
                        if (++i != m_ranges.cend())
                            ri = *i;
                    }
                    else
                    {
                        //When ri equals to rj
                        ret[2].append(Range<TCHAR>(ri.start(), rj.end()));
                        if (++i != m_ranges.cend())
                            ri = *i;
                        if (++j != cc.m_ranges.cend())
                            rj = *j;
                    }
                }
            }
        }

        while (i != m_ranges.cend())
        {
            ret[0].append(ri);
            if (++i != m_ranges.cend())
                ri = *i;
        }
        while (j != cc.m_ranges.cend())
        {
            ret[1].append(rj);
            if (++j != cc.m_ranges.cend())
                rj = *j;
        }

        /*std::cout << ret[0] << std::endl;
        std::cout << ret[1] << std::endl;
        std::cout << ret[2] << std::endl;*/

        return ret;
    }